

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::MakeCurrent::MakeCurrent
          (MakeCurrent *this,EGLThread *thread,EGLDisplay display,
          SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface,
          SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *context)

{
  SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *this_00;
  SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context> *this_01;
  GLES2Context *pGVar1;
  Surface *pSVar2;
  SharedPtr<tcu::ThreadUtil::Object> local_68;
  SharedPtr<tcu::ThreadUtil::Object> local_58;
  SharedPtr<tcu::ThreadUtil::Object> local_48;
  SharedPtr<tcu::ThreadUtil::Object> local_38;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"MakeCurrent");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__MakeCurrent_003d5d50;
  this->m_display = display;
  this_00 = &this->m_surface;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(this_00,surface);
  this_01 = &this->m_context;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::SharedPtr(this_01,context);
  pGVar1 = this_01->m_ptr;
  if (pGVar1 != (GLES2Context *)0x0) {
    local_38.m_state = (this->m_context).m_state;
    if (local_38.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_38.m_state)->strongRefCount = (local_38.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_38.m_state)->weakRefCount = (local_38.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_38.m_ptr = &pGVar1->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_38);
    de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_38);
  }
  pSVar2 = this_00->m_ptr;
  if (pSVar2 != (Surface *)0x0) {
    local_48.m_state = (this->m_surface).m_state;
    if (local_48.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_48.m_state)->strongRefCount = (local_48.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_48.m_state)->weakRefCount = (local_48.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_48.m_ptr = &pSVar2->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_48);
    de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_48);
  }
  pGVar1 = (thread->context).m_ptr;
  if (pGVar1 != (GLES2Context *)0x0) {
    local_58.m_state = (thread->context).m_state;
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_58.m_state)->strongRefCount = (local_58.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_58.m_state)->weakRefCount = (local_58.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_58.m_ptr = &pGVar1->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_58);
    de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_58);
  }
  pSVar2 = (thread->surface).m_ptr;
  if (pSVar2 != (Surface *)0x0) {
    local_68.m_state = (thread->surface).m_state;
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (local_68.m_state)->strongRefCount = (local_68.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (local_68.m_state)->weakRefCount = (local_68.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    local_68.m_ptr = &pSVar2->super_Object;
    tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_68);
    de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_68);
  }
  de::SharedPtr<deqp::egl::GLES2ThreadTest::GLES2Context>::operator=(&thread->context,this_01);
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::operator=(&thread->surface,this_00);
  return;
}

Assistant:

MakeCurrent::MakeCurrent (EGLThread& thread, EGLDisplay display, SharedPtr<Surface> surface, SharedPtr<GLES2Context> context)
	: tcu::ThreadUtil::Operation	("MakeCurrent")
	, m_display					(display)
	, m_surface					(surface)
	, m_context					(context)
{
	if (m_context)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_context));

	if (m_surface)
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_surface));

	// Release old contexts
	if (thread.context)
	{
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(thread.context));
	}

	// Release old surface
	if (thread.surface)
	{
		modifyObject(SharedPtr<tcu::ThreadUtil::Object>(thread.surface));
	}

	thread.context	= m_context;
	thread.surface	= m_surface;
}